

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::SSARewriter::AddPhiOperands(SSARewriter *this,PhiCandidate *phi_candidate)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  size_type sVar6;
  CFG *pCVar7;
  BasicBlock *this_00;
  reference puVar8;
  PhiCandidate *this_01;
  uint32_t local_7c;
  uint32_t repl_id;
  PhiCandidate *defining_phi;
  BasicBlock *pBStack_50;
  uint32_t arg_id;
  BasicBlock *pred_bb;
  const_iterator cStack_40;
  uint32_t pred;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  PhiCandidate *pPStack_20;
  bool found_0_arg;
  PhiCandidate *phi_candidate_local;
  SSARewriter *this_local;
  
  pPStack_20 = phi_candidate;
  phi_candidate_local = (PhiCandidate *)this;
  pvVar5 = PhiCandidate::phi_args(phi_candidate);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
  if (sVar6 == 0) {
    bVar1 = false;
    pCVar7 = Pass::cfg(&this->pass_->super_Pass);
    this_00 = PhiCandidate::bb(pPStack_20);
    uVar3 = BasicBlock::id(this_00);
    pvVar5 = CFG::preds(pCVar7,uVar3);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar5);
    cStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar5);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0), bVar2) {
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      pred_bb._4_4_ = *puVar8;
      pCVar7 = Pass::cfg(&this->pass_->super_Pass);
      pBStack_50 = CFG::block(pCVar7,pred_bb._4_4_);
      bVar2 = IsBlockSealed(this,pBStack_50);
      if (bVar2) {
        uVar3 = PhiCandidate::var_id(pPStack_20);
        local_7c = GetReachingDef(this,uVar3,pBStack_50);
      }
      else {
        local_7c = 0;
      }
      defining_phi._4_4_ = local_7c;
      pvVar5 = PhiCandidate::phi_args(pPStack_20);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar5,(value_type *)((long)&defining_phi + 4));
      if (defining_phi._4_4_ == 0) {
        bVar1 = true;
      }
      else {
        this_01 = GetPhiCandidate(this,defining_phi._4_4_);
        if ((this_01 != (PhiCandidate *)0x0) && (this_01 != pPStack_20)) {
          uVar3 = PhiCandidate::result_id(pPStack_20);
          PhiCandidate::AddUser(this_01,uVar3);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    if (bVar1) {
      PhiCandidate::MarkIncomplete(pPStack_20);
      std::
      queue<spvtools::opt::SSARewriter::PhiCandidate_*,_std::deque<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>_>
      ::push(&this->incomplete_phis_,&stack0xffffffffffffffe0);
      this_local._4_4_ = PhiCandidate::result_id(pPStack_20);
    }
    else {
      uVar3 = TryRemoveTrivialPhi(this,pPStack_20);
      uVar4 = PhiCandidate::result_id(pPStack_20);
      this_local._4_4_ = uVar3;
      if (uVar3 == uVar4) {
        PhiCandidate::MarkComplete(pPStack_20);
        std::
        vector<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
        ::push_back(&this->phis_to_generate_,&stack0xffffffffffffffe0);
      }
    }
    return this_local._4_4_;
  }
  __assert_fail("phi_candidate->phi_args().size() == 0 && \"Phi candidate already has arguments\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                ,0xa7,"uint32_t spvtools::opt::SSARewriter::AddPhiOperands(PhiCandidate *)");
}

Assistant:

uint32_t SSARewriter::AddPhiOperands(PhiCandidate* phi_candidate) {
  assert(phi_candidate->phi_args().size() == 0 &&
         "Phi candidate already has arguments");

  bool found_0_arg = false;
  for (uint32_t pred : pass_->cfg()->preds(phi_candidate->bb()->id())) {
    BasicBlock* pred_bb = pass_->cfg()->block(pred);

    // If |pred_bb| is not sealed, use %0 to indicate that
    // |phi_candidate| needs to be completed after the whole CFG has
    // been processed.
    //
    // Note that we cannot call GetReachingDef() in these cases
    // because this would generate an empty Phi candidate in
    // |pred_bb|.  When |pred_bb| is later processed, a new definition
    // for |phi_candidate->var_id_| will be lost because
    // |phi_candidate| will still be reached by the empty Phi.
    //
    // Consider:
    //
    //       BB %23:
    //           %38 = Phi[%i](%int_0[%1], %39[%25])
    //
    //           ...
    //
    //       BB %25: [Starts unsealed]
    //       %39 = Phi[%i]()
    //       %34 = ...
    //       OpStore %i %34    -> Currdef(%i) at %25 is %34
    //       OpBranch %23
    //
    // When we first create the Phi in %38, we add an operandless Phi in
    // %39 to hold the unknown reaching def for %i.
    //
    // But then, when we go to complete %39 at the end.  The reaching def
    // for %i in %25's predecessor is %38 itself.  So we miss the fact
    // that %25 has a def for %i that should be used.
    //
    // By making the argument %0, we make |phi_candidate| incomplete,
    // which will cause it to be completed after the whole CFG has
    // been scanned.
    uint32_t arg_id = IsBlockSealed(pred_bb)
                          ? GetReachingDef(phi_candidate->var_id(), pred_bb)
                          : 0;
    phi_candidate->phi_args().push_back(arg_id);

    if (arg_id == 0) {
      found_0_arg = true;
    } else {
      // If this argument is another Phi candidate, add |phi_candidate| to the
      // list of users for the defining Phi.
      PhiCandidate* defining_phi = GetPhiCandidate(arg_id);
      if (defining_phi && defining_phi != phi_candidate) {
        defining_phi->AddUser(phi_candidate->result_id());
      }
    }
  }

  // If we could not fill-in all the arguments of this Phi, mark it incomplete
  // so it gets completed after the whole CFG has been processed.
  if (found_0_arg) {
    phi_candidate->MarkIncomplete();
    incomplete_phis_.push(phi_candidate);
    return phi_candidate->result_id();
  }

  // Try to remove |phi_candidate|, if it's trivial.
  uint32_t repl_id = TryRemoveTrivialPhi(phi_candidate);
  if (repl_id == phi_candidate->result_id()) {
    // |phi_candidate| is complete and not trivial.  Add it to the
    // list of Phi candidates to generate.
    phi_candidate->MarkComplete();
    phis_to_generate_.push_back(phi_candidate);
  }

  return repl_id;
}